

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForTorCorrFunc.cpp
# Opt level: O0

void __thiscall
OpenMD::ForTorCorrFunc::validateSelection(ForTorCorrFunc *this,SelectionManager *seleMan)

{
  bool bVar1;
  uint uVar2;
  undefined8 uVar3;
  int i;
  StuntDouble *sd;
  StuntDouble *in_stack_ffffffffffffffc0;
  int *in_stack_ffffffffffffffc8;
  SelectionManager *in_stack_ffffffffffffffd0;
  StuntDouble *local_18;
  
  local_18 = SelectionManager::beginSelected(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  while (local_18 != (StuntDouble *)0x0) {
    bVar1 = StuntDouble::isDirectional(in_stack_ffffffffffffffc0);
    if (!bVar1) {
      uVar2 = StuntDouble::getGlobalIndex(local_18);
      (*local_18->_vptr_StuntDouble[7])(&stack0xffffffffffffffc0);
      uVar3 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,
               "ForTorCorrFunc::validateSelection Error: selection %d (%s)\n\t is not a Directional object\n"
               ,(ulong)uVar2,uVar3);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
      painCave.isFatal = 1;
      simError();
    }
    local_18 = SelectionManager::nextSelected(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void ForTorCorrFunc::validateSelection(SelectionManager& seleMan) {
    StuntDouble* sd;
    int i;

    for (sd = seleMan.beginSelected(i); sd != NULL;
         sd = seleMan.nextSelected(i)) {
      if (!sd->isDirectional()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "ForTorCorrFunc::validateSelection Error: selection "
                 "%d (%s)\n"
                 "\t is not a Directional object\n",
                 sd->getGlobalIndex(), sd->getType().c_str());
        painCave.isFatal = 1;
        simError();
      }
    }
  }